

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_str_insert_at_char(nk_str *s,int pos,char *str,int len)

{
  int iVar1;
  void *pvVar2;
  char *pcStack_48;
  int copylen;
  char *dst;
  char *src;
  void *mem;
  int i;
  int len_local;
  char *str_local;
  int pos_local;
  nk_str *s_local;
  
  if (s == (nk_str *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x2078,"int nk_str_insert_at_char(struct nk_str *, int, const char *, int)");
  }
  if (str == (char *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x2079,"int nk_str_insert_at_char(struct nk_str *, int, const char *, int)");
  }
  if (len < 0) {
    __assert_fail("len >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x207a,"int nk_str_insert_at_char(struct nk_str *, int, const char *, int)");
  }
  if ((((s == (nk_str *)0x0) || (str == (char *)0x0)) || (len == 0)) ||
     ((s->buffer).allocated < (ulong)(long)pos)) {
    s_local._4_4_ = 0;
  }
  else if (((s->buffer).allocated + (long)len < (s->buffer).memory.size) ||
          ((s->buffer).type != NK_BUFFER_FIXED)) {
    iVar1 = (int)(s->buffer).allocated - pos;
    if (iVar1 == 0) {
      nk_str_append_text_char(s,str,len);
      s_local._4_4_ = 1;
    }
    else {
      pvVar2 = nk_buffer_alloc(&s->buffer,NK_BUFFER_FRONT,(long)len,0);
      if (pvVar2 == (void *)0x0) {
        s_local._4_4_ = 0;
      }
      else {
        if (pos + len + iVar1 + -1 < 0) {
          __assert_fail("((int)pos + (int)len + ((int)copylen - 1)) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                        ,0x2088,"int nk_str_insert_at_char(struct nk_str *, int, const char *, int)"
                       );
        }
        if (pos + iVar1 + -1 < 0) {
          __assert_fail("((int)pos + ((int)copylen - 1)) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                        ,0x2089,"int nk_str_insert_at_char(struct nk_str *, int, const char *, int)"
                       );
        }
        pcStack_48 = (char *)((long)(s->buffer).memory.ptr + (long)(pos + len + iVar1 + -1));
        dst = (char *)((long)(s->buffer).memory.ptr + (long)(pos + iVar1 + -1));
        for (mem._0_4_ = 0; (int)mem < iVar1; mem._0_4_ = (int)mem + 1) {
          *pcStack_48 = *dst;
          pcStack_48 = pcStack_48 + -1;
          dst = dst + -1;
        }
        nk_memcopy((void *)((long)(s->buffer).memory.ptr + (long)pos),str,(long)len);
        iVar1 = nk_utf_len((char *)(s->buffer).memory.ptr,(int)(s->buffer).allocated);
        s->len = iVar1;
        s_local._4_4_ = 1;
      }
    }
  }
  else {
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

NK_API int
nk_str_insert_at_char(struct nk_str *s, int pos, const char *str, int len)
{
    int i;
    void *mem;
    char *src;
    char *dst;

    int copylen;
    NK_ASSERT(s);
    NK_ASSERT(str);
    NK_ASSERT(len >= 0);
    if (!s || !str || !len || (nk_size)pos > s->buffer.allocated) return 0;
    if ((s->buffer.allocated + (nk_size)len >= s->buffer.memory.size) &&
        (s->buffer.type == NK_BUFFER_FIXED)) return 0;

    copylen = (int)s->buffer.allocated - pos;
    if (!copylen) {
        nk_str_append_text_char(s, str, len);
        return 1;
    }
    mem = nk_buffer_alloc(&s->buffer, NK_BUFFER_FRONT, (nk_size)len * sizeof(char), 0);
    if (!mem) return 0;

    /* memmove */
    NK_ASSERT(((int)pos + (int)len + ((int)copylen - 1)) >= 0);
    NK_ASSERT(((int)pos + ((int)copylen - 1)) >= 0);
    dst = nk_ptr_add(char, s->buffer.memory.ptr, pos + len + (copylen - 1));
    src = nk_ptr_add(char, s->buffer.memory.ptr, pos + (copylen-1));
    for (i = 0; i < copylen; ++i) *dst-- = *src--;
    mem = nk_ptr_add(void, s->buffer.memory.ptr, pos);
    NK_MEMCPY(mem, str, (nk_size)len * sizeof(char));
    s->len = nk_utf_len((char *)s->buffer.memory.ptr, (int)s->buffer.allocated);
    return 1;
}